

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O3

void __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::HashMap(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
          *this,size_type capacity)

{
  vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  *this_00;
  pointer pGVar1;
  int iVar2;
  Team *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *pHVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  runtime_error *this_01;
  ulong uVar5;
  long lVar6;
  uint64_t root;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  GVar7;
  value_type local_38;
  
  this->capacity_ = capacity;
  pTVar3 = (Team *)operator_new(8);
  pTVar3->_vptr_Team = (_func_int **)&PTR_resolve_0010a8c8;
  (this->team_ptr_)._M_t.super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>._M_t.
  super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
  super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl = pTVar3;
  this_00 = &this->hash_table_;
  (this->hash_table_).
  super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hash_table_).
  super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hash_table_).
  super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = my_nprocs;
  this->local_capacity_ = ((capacity + my_nprocs) - 1) / my_nprocs;
  local_38.rank = 0;
  local_38.ptr = 0;
  std::
  vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ::resize(this_00,uVar5,&local_38);
  GVar7 = local_malloc<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
                    (this->local_capacity_);
  pTVar3 = (this->team_ptr_)._M_t.super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>.
           _M_t.super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
           super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl;
  iVar2 = (**pTVar3->_vptr_Team)(pTVar3,my_rank);
  pGVar1 = (this->hash_table_).
           super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar1[CONCAT44(extraout_var,iVar2)].rank = GVar7.rank;
  pGVar1[CONCAT44(extraout_var,iVar2)].ptr = GVar7.ptr;
  pTVar3 = (this->team_ptr_)._M_t.super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>.
           _M_t.super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
           super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl;
  iVar2 = (**pTVar3->_vptr_Team)(pTVar3,my_rank);
  pGVar1 = (this_00->
           super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pGVar1[CONCAT44(extraout_var_00,iVar2)].ptr != 0 ||
      pGVar1[CONCAT44(extraout_var_00,iVar2)].rank != 0) {
    pTVar3 = (this->team_ptr_)._M_t.
             super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>._M_t.
             super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
             super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl;
    iVar2 = (**pTVar3->_vptr_Team)(pTVar3,my_rank);
    pHVar4 = GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
             ::local((this_00->
                     super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + CONCAT44(extraout_var_01,iVar2));
    if (this->local_capacity_ != 0) {
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
        (pHVar4->key).len = 0;
        pHVar4->val = 0;
        pHVar4->used = 0;
        (pHVar4->key).ptr.rank = 0;
        (pHVar4->key).ptr.ptr = 0;
        pHVar4 = pHVar4 + 1;
      } while (uVar5 < this->local_capacity_);
    }
    iVar2 = (*((this->team_ptr_)._M_t.
               super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>._M_t.
               super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
               super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl)->_vptr_Team[1])();
    if (CONCAT44(extraout_var_02,iVar2) != 0) {
      lVar6 = 0;
      root = 0;
      do {
        GVar7 = broadcast<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>>
                          ((GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
                            *)((long)&((this_00->
                                       super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->rank + lVar6),
                           root);
        pGVar1 = (this->hash_table_).
                 super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(size_t *)((long)&pGVar1->rank + lVar6) = GVar7.rank;
        *(size_t *)((long)&pGVar1->ptr + lVar6) = GVar7.ptr;
        root = root + 1;
        iVar2 = (*((this->team_ptr_)._M_t.
                   super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>._M_t.
                   super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
                   super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl)->_vptr_Team[1])();
        lVar6 = lVar6 + 0x10;
      } while (root < CONCAT44(extraout_var_03,iVar2));
    }
    barrier();
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"BCL::HashMap: ran out of memory\n");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

HashMap(size_type capacity) : capacity_(capacity), team_ptr_(new BCL::WorldTeam()) {
    local_capacity_ = (capacity_ + BCL::nprocs(team()) - 1) / BCL::nprocs(team());
    hash_table_.resize(BCL::nprocs(team()), nullptr);

    hash_table_[BCL::rank(team())] = BCL::alloc <HME> (local_capacity_);

    if (hash_table_[BCL::rank(team())] == nullptr) {
      throw std::runtime_error("BCL::HashMap: ran out of memory\n");
    }

    HME* local_table = hash_table_[BCL::rank(team())].local();
    for (size_type i = 0; i < local_capacity_; i++) {
        new (&local_table[i]) HME();
    }

    for (size_type rank = 0; rank < BCL::nprocs(team()); rank++) {
      hash_table_[rank] = BCL::broadcast(hash_table_[rank], rank);
    }
    BCL::barrier();
  }